

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

uint pcmpxstrx(CPUX86State *env,ZMMReg *d,ZMMReg *s,int8_t ctrl,int valids,int validd)

{
  sbyte sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_68;
  int local_64;
  int local_5c;
  int local_58;
  bool local_4d;
  uint local_3c;
  int upper;
  int i;
  int j;
  int v;
  uint res;
  int validd_local;
  int valids_local;
  int8_t ctrl_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  j = 0;
  iVar3 = (uint)((ctrl & 1U) == 0) * 8 + 7;
  iVar4 = valids + -1;
  local_68 = validd + -1;
  env->cc_src = (ulong)((uint)(iVar4 < iVar3) << 6 | (uint)(local_68 < iVar3) << 7);
  sVar1 = (sbyte)iVar3;
  upper = iVar4;
  switch((byte)ctrl >> 2 & 3) {
  case 0:
    for (; -1 < upper; upper = upper + -1) {
      j = j << 1;
      iVar3 = pcmp_val(s,ctrl,upper);
      for (local_3c = local_68; -1 < (int)local_3c; local_3c = local_3c + -1) {
        iVar5 = pcmp_val(d,ctrl,local_3c);
        j = (uint)(iVar3 == iVar5) | j;
      }
    }
    break;
  case 1:
    for (; -1 < upper; upper = upper + -1) {
      j = j << 1;
      iVar3 = pcmp_val(s,ctrl,upper);
      for (local_3c = validd - 2U | 1; -1 < (int)local_3c; local_3c = local_3c - 2) {
        iVar5 = pcmp_val(d,ctrl,local_3c);
        local_4d = false;
        if (iVar3 <= iVar5) {
          iVar5 = pcmp_val(d,ctrl,local_3c - 1);
          local_4d = iVar5 <= iVar3;
        }
        j = (uint)local_4d | j;
      }
    }
    break;
  case 2:
    local_58 = local_68;
    if (local_68 < iVar4) {
      local_58 = iVar4;
    }
    local_5c = local_68;
    if (local_68 < iVar4) {
      local_5c = iVar4;
    }
    local_64 = local_68;
    if (iVar4 < local_68) {
      local_64 = iVar4;
    }
    j = (1 << (sVar1 - (char)local_58 & 0x1fU)) + -1 << ((char)local_5c - (char)local_64 & 0x1fU);
    if (iVar4 < local_68) {
      local_68 = iVar4;
    }
    for (local_3c = local_68; -1 < (int)local_3c; local_3c = local_3c + -1) {
      iVar3 = pcmp_val(s,ctrl,local_3c);
      iVar5 = pcmp_val(d,ctrl,local_3c);
      j = (uint)(iVar3 == iVar5) | j << 1;
    }
    break;
  case 3:
    if (local_68 == -1) {
      j = (2 << sVar1) + -1;
    }
    else {
      for (upper = iVar4 - local_68; -1 < upper; upper = upper + -1) {
        i = 1;
        for (local_3c = local_68; -1 < (int)local_3c; local_3c = local_3c + -1) {
          iVar3 = pcmp_val(s,ctrl,local_3c + upper);
          iVar5 = pcmp_val(d,ctrl,local_3c);
          i = (uint)(iVar3 == iVar5) & i;
        }
        j = i | j << 1;
      }
    }
  }
  bVar2 = (byte)ctrl >> 4 & 3;
  if (bVar2 == 1) {
    j = (2 << sVar1) - 1U ^ j;
  }
  else if (bVar2 == 3) {
    j = (1 << ((char)iVar4 + 1U & 0x1f)) - 1U ^ j;
  }
  if (j != 0) {
    env->cc_src = env->cc_src | 1;
  }
  if ((j & 1U) != 0) {
    env->cc_src = env->cc_src | 0x800;
  }
  return j;
}

Assistant:

static inline unsigned pcmpxstrx(CPUX86State *env, Reg *d, Reg *s,
                                 int8_t ctrl, int valids, int validd)
{
    unsigned int res = 0;
    int v;
    int j, i;
    int upper = (ctrl & 1) ? 7 : 15;

    valids--;
    validd--;

    CC_SRC = (valids < upper ? CC_Z : 0) | (validd < upper ? CC_S : 0);

    switch ((ctrl >> 2) & 3) {
    case 0:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = validd; i >= 0; i--) {
                res |= (v == pcmp_val(d, ctrl, i));
            }
        }
        break;
    case 1:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = ((validd - 1) | 1); i >= 0; i -= 2) {
                res |= (pcmp_val(d, ctrl, i - 0) >= v &&
                        pcmp_val(d, ctrl, i - 1) <= v);
            }
        }
        break;
    case 2:
        res = (1 << (upper - MAX(valids, validd))) - 1;
        res <<= MAX(valids, validd) - MIN(valids, validd);
        for (i = MIN(valids, validd); i >= 0; i--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, i);
            res |= (v == pcmp_val(d, ctrl, i));
        }
        break;
    case 3:
        if (validd == -1) {
            res = (2 << upper) - 1;
            break;
        }
        for (j = valids - validd; j >= 0; j--) {
            res <<= 1;
            v = 1;
            for (i = validd; i >= 0; i--) {
                v &= (pcmp_val(s, ctrl, i + j) == pcmp_val(d, ctrl, i));
            }
            res |= v;
        }
        break;
    }

    switch ((ctrl >> 4) & 3) {
    case 1:
        res ^= (2 << upper) - 1;
        break;
    case 3:
        res ^= (1 << (valids + 1)) - 1;
        break;
    }

    if (res) {
        CC_SRC |= CC_C;
    }
    if (res & 1) {
        CC_SRC |= CC_O;
    }

    return res;
}